

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fglrx.c
# Opt level: O2

void decode_fglrx_ioctl_54(fglrx_ioctl_54 *d)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = d->unk00;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk00");
    if (iVar2 != 0) goto LAB_0024acec;
  }
  else {
LAB_0024acec:
    fprintf(_stdout,"%sunk00: 0x%08x",fglrx_pfx,(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk04;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk04");
    if (iVar2 != 0) goto LAB_0024ad32;
  }
  else {
LAB_0024ad32:
    fprintf(_stdout,"%sunk04: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk08;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk08");
    if (iVar2 != 0) goto LAB_0024ad71;
  }
  else {
LAB_0024ad71:
    fprintf(_stdout,"%sunk08: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk0c;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk0c");
    if (iVar2 != 0) goto LAB_0024adb0;
  }
  else {
LAB_0024adb0:
    fprintf(_stdout,"%sunk0c: 0x%08x",", ",(ulong)uVar1);
  }
  fglrx_pfx = ", ";
  uVar1 = d->unk10;
  if (uVar1 == 0) {
    iVar2 = _fglrx_field_enabled("unk10");
    if (iVar2 == 0) goto LAB_0024ae10;
  }
  fprintf(_stdout,"%sunk10: 0x%08x",", ",(ulong)uVar1);
LAB_0024ae10:
  fglrx_pfx = ", ";
  fputc(10,_stdout);
  if (mmt_sync_fd != -1) {
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

static void decode_fglrx_ioctl_54(struct fglrx_ioctl_54 *d)
{
	fglrx_print_x32(d, unk00);
	fglrx_print_x32(d, unk04);
	fglrx_print_x32(d, unk08);
	fglrx_print_x32(d, unk0c);
	fglrx_print_x32(d, unk10);
	mmt_log_cont_nl();
}